

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,FilterFunction f)

{
  char *pcVar1;
  char *pcVar2;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Point";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Bilinear";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Trilinear";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "EWA";
    pcVar1 = "";
    break;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
             ,0x26,"Unhandled case");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(FilterFunction f) {
    switch (f) {
    case FilterFunction::Point:
        return "Point";
    case FilterFunction::Bilinear:
        return "Bilinear";
    case FilterFunction::Trilinear:
        return "Trilinear";
    case FilterFunction::EWA:
        return "EWA";
    default:
        LOG_FATAL("Unhandled case");
        return "";
    }
}